

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
::rebalance_left_to_right
          (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
           *this,field_type to_move,
          btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
          *right,allocator_type *alloc)

{
  size_type n;
  bool bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
  bVar5;
  btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
  *pbVar6;
  char cVar7;
  btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
  i;
  
  if ((((ulong)this & 7) != 0) || (((ulong)right & 7) != 0)) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                  ,0x1fe,
                  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>> *, unsigned int, unsigned char, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 6, 7>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>> *, unsigned int, unsigned char, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 6, 7>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, Offset..." /* TRUNCATED STRING LITERAL */
                 );
  }
  if (*(long *)this != *(long *)right) {
    __assert_fail("parent() == right->parent()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x760,
                  "void absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>>::rebalance_left_to_right(field_type, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>]"
                 );
  }
  if ((byte)this[8] + 1 == (uint)(byte)right[8]) {
    bVar2 = count(this);
    bVar3 = count(right);
    if (bVar2 < bVar3) {
      __assert_fail("count() >= right->count()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                    ,0x762,
                    "void absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>>::rebalance_left_to_right(field_type, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>]"
                   );
    }
    if (to_move != '\0') {
      bVar2 = count(this);
      if (to_move <= bVar2) {
        bVar2 = count(right);
        bVar3 = start(right);
        bVar4 = start(right);
        transfer_n_backward(right,(ulong)bVar2,(ulong)((uint)bVar3 + (uint)to_move),(ulong)bVar4,
                            right,alloc);
        bVar2 = start(right);
        n = (ulong)to_move - 1;
        transfer(right,(ulong)((uint)bVar2 + (int)n),(ulong)(byte)this[8],
                 *(btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
                   **)this,alloc);
        bVar2 = start(right);
        transfer_n(right,n,(ulong)bVar2,(byte)this[10] - n,this,alloc);
        transfer(*(btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
                   **)this,(ulong)(byte)this[8],(ulong)(byte)this[10] - (ulong)to_move,this,alloc);
        if (this[0xb] ==
            (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
             )0x0) {
          i = right[10];
          bVar2 = start(right);
          if (bVar2 < (byte)((char)i + 1U)) {
            do {
              pbVar6 = child(right,(field_type)i);
              init_child(right,to_move + (char)i,pbVar6);
              mutable_child(right,(field_type)i);
              bVar5 = (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
                       )start(right);
              bVar1 = (byte)bVar5 < (byte)i;
              i = (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
                   )((char)i + -1);
            } while (bVar1);
          }
          bVar2 = 1;
          cVar7 = -to_move;
          do {
            cVar7 = cVar7 + '\x01';
            pbVar6 = child(this,(char)this[10] + cVar7);
            init_child(right,bVar2 - 1,pbVar6);
            mutable_child(this,(char)this[10] + cVar7);
            bVar2 = bVar2 + 1;
          } while (bVar2 <= to_move);
        }
        this[10] = (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
                    )((char)this[10] - to_move);
        right[10] = (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
                     )((char)right[10] + to_move);
        return;
      }
      __assert_fail("to_move <= count()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                    ,0x764,
                    "void absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>>::rebalance_left_to_right(field_type, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>]"
                   );
    }
    __assert_fail("to_move >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x763,
                  "void absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>>::rebalance_left_to_right(field_type, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>]"
                 );
  }
  __assert_fail("position() + 1 == right->position()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                ,0x761,
                "void absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>>::rebalance_left_to_right(field_type, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>]"
               );
}

Assistant:

void btree_node<P>::rebalance_left_to_right(field_type to_move,
                                            btree_node *right,
                                            allocator_type *alloc) {
  assert(parent() == right->parent());
  assert(position() + 1 == right->position());
  assert(count() >= right->count());
  assert(to_move >= 1);
  assert(to_move <= count());

  // Values in the right node are shifted to the right to make room for the
  // new to_move values. Then, the delimiting value in the parent and the
  // other (to_move - 1) values in the left node are moved into the right node.
  // Lastly, a new delimiting value is moved from the left node into the
  // parent, and the remaining empty left node entries are destroyed.

  // 1) Shift existing values in the right node to their correct positions.
  right->transfer_n_backward(right->count(), right->start() + to_move,
                             right->start(), right, alloc);

  // 2) Move the delimiting value in the parent to the right node.
  right->transfer(right->start() + to_move - 1, position(), parent(), alloc);

  // 3) Move the (to_move - 1) values from the left node to the right node.
  right->transfer_n(to_move - 1, right->start(), finish() - (to_move - 1), this,
                    alloc);

  // 4) Move the new delimiting value to the parent from the left node.
  parent()->transfer(position(), finish() - to_move, this, alloc);

  if (is_internal()) {
    // Move the child pointers from the left to the right node.
    for (field_type i = right->finish() + 1; i > right->start(); --i) {
      right->init_child(i - 1 + to_move, right->child(i - 1));
      right->clear_child(i - 1);
    }
    for (field_type i = 1; i <= to_move; ++i) {
      right->init_child(i - 1, child(finish() - to_move + i));
      clear_child(finish() - to_move + i);
    }
  }

  // Fixup the counts on the left and right nodes.
  set_finish(finish() - to_move);
  right->set_finish(right->finish() + to_move);
}